

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O2

void __thiscall QProgressDialog::reset(QProgressDialog *this)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  if ((*(char *)(lVar1 + 0x34a) != '\0') || (*(char *)(lVar1 + 0x34c) == '\x01')) {
    QWidget::hide((QWidget *)this);
  }
  QProgressBar::reset(*(QProgressBar **)(lVar1 + 0x2f0));
  *(undefined2 *)(lVar1 + 0x34d) = 0;
  *(undefined1 *)(lVar1 + 0x349) = 0;
  QTimer::stop();
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x308));
  if (bVar2) {
    QMetaObject::invokeMethod<>((QObject *)this,"_q_disconnectOnClose",QueuedConnection);
    return;
  }
  return;
}

Assistant:

void QProgressDialog::reset()
{
    Q_D(QProgressDialog);
    if (d->autoClose || d->forceHide)
        hide();
    d->bar->reset();
    d->cancellationFlag = false;
    d->shownOnce = false;
    d->setValueCalled = false;
    d->forceTimer->stop();

    /*
        I wish we could disconnect the user slot provided to open() here but
        unfortunately reset() is usually called before the slot has been invoked.
        (reset() is itself invoked when canceled() is emitted.)
    */
    if (d->receiverToDisconnectOnClose)
        QMetaObject::invokeMethod(this, "_q_disconnectOnClose", Qt::QueuedConnection);
}